

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_name.cc
# Opt level: O3

bool bssl::ConvertToRFC2253(RDNSequence *rdn_sequence,string *out)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pvVar2;
  pointer pvVar3;
  pointer pXVar4;
  bool bVar5;
  ulong uVar6;
  byte bVar7;
  pointer this;
  undefined8 uVar8;
  string rdn_string;
  string atv_string;
  RelativeDistinguishedName rdn;
  string rdns_string;
  undefined1 *local_d8;
  long local_d0;
  undefined1 local_c8;
  undefined7 uStack_c7;
  string local_b8;
  vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_> local_98;
  undefined1 *local_80;
  long local_78;
  undefined1 local_70;
  undefined7 uStack_6f;
  string *local_60;
  ulong local_58;
  ulong local_50;
  undefined8 local_48;
  long local_40;
  RDNSequence *local_38;
  
  local_80 = &local_70;
  local_78 = 0;
  local_70 = 0;
  pvVar2 = (rdn_sequence->
           super__Vector_base<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pvVar3 = (rdn_sequence->
           super__Vector_base<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_40 = (long)pvVar2 - (long)pvVar3;
  local_60 = out;
  local_38 = rdn_sequence;
  if (local_40 == 0) {
    uVar8 = 1;
  }
  else {
    local_50 = ((long)pvVar2 - (long)pvVar3 >> 3) * -0x5555555555555555;
    paVar1 = &local_b8.field_2;
    local_58 = local_50 + (local_50 == 0);
    uVar8 = 0;
    uVar6 = 0;
    do {
      local_48 = uVar8;
      ::std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>::vector
                (&local_98,
                 (vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_> *)
                 ((long)&(local_38->
                         super__Vector_base<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start[~uVar6].
                         super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                         ._M_impl.super__Vector_impl_data + local_40));
      pXVar4 = local_98.
               super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_d0 = 0;
      local_c8 = 0;
      local_d8 = &local_c8;
      for (this = local_98.
                  super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                  ._M_impl.super__Vector_impl_data._M_start; this != pXVar4; this = this + 1) {
        if (local_d0 != 0) {
          ::std::__cxx11::string::append((char *)&local_d8);
        }
        local_b8._M_string_length = 0;
        local_b8.field_2._M_local_buf[0] = '\0';
        local_b8._M_dataplus._M_p = (pointer)paVar1;
        bVar5 = X509NameAttribute::AsRFC2253String(this,&local_b8);
        if (!bVar5) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != paVar1) {
            operator_delete(local_b8._M_dataplus._M_p,
                            CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                                     local_b8.field_2._M_local_buf[0]) + 1);
          }
          bVar7 = (byte)local_48;
          if (local_d8 != &local_c8) {
            operator_delete(local_d8,CONCAT71(uStack_c7,local_c8) + 1);
          }
          if (local_98.
              super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>.
              _M_impl.super__Vector_impl_data._M_start != (X509NameAttribute *)0x0) {
            operator_delete(local_98.
                            super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_98.
                                  super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_98.
                                  super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          goto LAB_004a7e42;
        }
        ::std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_b8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != paVar1) {
          operator_delete(local_b8._M_dataplus._M_p,
                          CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                                   local_b8.field_2._M_local_buf[0]) + 1);
        }
      }
      if (local_78 != 0) {
        ::std::__cxx11::string::append((char *)&local_80);
      }
      ::std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_d8);
      if (local_d8 != &local_c8) {
        operator_delete(local_d8,CONCAT71(uStack_c7,local_c8) + 1);
      }
      if (local_98.
          super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>.
          _M_impl.super__Vector_impl_data._M_start != (X509NameAttribute *)0x0) {
        operator_delete(local_98.
                        super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_98.
                              super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_98.
                              super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      uVar6 = uVar6 + 1;
      uVar8 = CONCAT71((int7)((ulong)this >> 8),local_50 <= uVar6);
    } while (uVar6 != local_58);
  }
  bVar7 = (byte)uVar8;
  ::std::__cxx11::string::_M_assign((string *)local_60);
LAB_004a7e42:
  if (local_80 != &local_70) {
    operator_delete(local_80,CONCAT71(uStack_6f,local_70) + 1);
  }
  return (bool)(bVar7 & 1);
}

Assistant:

bool ParseNameValue(der::Input name_value, RDNSequence *out) {
  der::Parser rdn_sequence_parser(name_value);
  while (rdn_sequence_parser.HasMore()) {
    der::Parser rdn_parser;
    if (!rdn_sequence_parser.ReadConstructed(CBS_ASN1_SET, &rdn_parser)) {
      return false;
    }
    RelativeDistinguishedName type_and_values;
    if (!ReadRdn(&rdn_parser, &type_and_values)) {
      return false;
    }
    out->push_back(type_and_values);
  }

  return true;
}